

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

void printUnsignedImm(MCInst *MI,int opNum,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  SStream *O_00;
  ulong val;
  uint8_t *puVar3;
  uint in_ESI;
  MCInst *in_RDI;
  int64_t imm;
  MCOperand *MO;
  undefined4 in_stack_fffffffffffffff0;
  
  O_00 = (SStream *)MCInst_getOperand(in_RDI,in_ESI);
  _Var2 = MCOperand_isImm((MCOperand *)O_00);
  if (_Var2) {
    val = MCOperand_getImm((MCOperand *)O_00);
    printInt64(O_00,val);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar3 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.prefix[0] * 0x18 + 0x15;
      puVar3[0] = '\x02';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      *(ulong *)(in_RDI->flat_insn->detail->groups +
                (ulong)(in_RDI->flat_insn->detail->field_6).x86.prefix[0] * 0x18 + 0x1d) =
           val & 0xffff;
      pcVar1 = in_RDI->flat_insn->detail;
      (pcVar1->field_6).x86.prefix[0] = (pcVar1->field_6).x86.prefix[0] + '\x01';
    }
  }
  else {
    printOperand((MCInst *)imm,(uint)((ulong)in_RDI >> 0x20),
                 (SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

static void printUnsignedImm(MCInst *MI, int opNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, opNum);
	if (MCOperand_isImm(MO)) {
		int64_t imm = MCOperand_getImm(MO);
		printInt64(O, imm);

		if (MI->csh->detail) {
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].type = MIPS_OP_IMM;
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].imm = (unsigned short int)imm;
			MI->flat_insn->detail->mips.op_count++;
		}
	} else
		printOperand(MI, opNum, O);
}